

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_dup_x2(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  Value operand_00;
  Value operand_01;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(this_01);
  operand_00 = Frame::popTopOfOperandStack(this_01);
  operand_01 = Frame::popTopOfOperandStack(this_01);
  if (operand._0_8_ >> 0x20 == 7) {
    __assert_fail("value_1.type != ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x740,"void ExecutionEngine::i_dup_x2()");
  }
  if (operand.type == LONG) {
    __assert_fail("value_1.type != ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x73f,"void ExecutionEngine::i_dup_x2()");
  }
  if (operand_01._0_8_ >> 0x20 == 7) {
    __assert_fail("value_3.type != ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x742,"void ExecutionEngine::i_dup_x2()");
  }
  if (operand_01.type != LONG) {
    Frame::pushIntoOperandStack(this_01,operand);
    Frame::pushIntoOperandStack(this_01,operand_01);
    Frame::pushIntoOperandStack(this_01,operand_00);
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_3.type != ValueType::LONG",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x741,"void ExecutionEngine::i_dup_x2()");
}

Assistant:

void ExecutionEngine::i_dup_x2() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value_1 = topFrame->popTopOfOperandStack();
    Value value_2 = topFrame->popTopOfOperandStack();
    Value value_3 = topFrame->popTopOfOperandStack();

    assert(value_1.type != ValueType::LONG);
    assert(value_1.type != ValueType::DOUBLE);
    assert(value_3.type != ValueType::LONG);
    assert(value_3.type != ValueType::DOUBLE);

    topFrame->pushIntoOperandStack(value_1);
    topFrame->pushIntoOperandStack(value_3);
    topFrame->pushIntoOperandStack(value_2);
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}